

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::limitsToBounds
          (HighsMipSolverData *this,double *dual_bound,double *primal_bound,double *mip_rel_gap)

{
  double *pdVar1;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double dVar2;
  double unaff_retaddr;
  
  dVar2 = limitsToGap((HighsMipSolverData *)primal_bound,(double)mip_rel_gap,unaff_retaddr,in_RDI,
                      in_RSI);
  *in_RCX = dVar2;
  pdVar1 = std::min<double>((double *)(*(long *)((long)*in_RDI + 8) + 0x140),in_RDX);
  *in_RDX = *pdVar1;
  if (*(int *)(*(long *)((long)*in_RDI + 0x18) + 0xf0) == -1) {
    *in_RSI = -*in_RSI;
    *in_RDX = -*in_RDX;
  }
  return;
}

Assistant:

void HighsMipSolverData::limitsToBounds(double& dual_bound,
                                        double& primal_bound,
                                        double& mip_rel_gap) const {
  mip_rel_gap = limitsToGap(lower_bound, upper_bound, dual_bound, primal_bound);
  primal_bound =
      std::min(mipsolver.options_mip_->objective_bound, primal_bound);
  // Adjust objective sense in case of maximization problem
  if (this->mipsolver.orig_model_->sense_ == ObjSense::kMaximize) {
    dual_bound = -dual_bound;
    primal_bound = -primal_bound;
  }
}